

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getRhol(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_88;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_88);
  return (RealType)local_88;
}

Assistant:

RealType EAMAdapter::getRhol() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.rhol;
  }